

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

SRes LzmaDec_AllocateProbs2(CLzmaDec *p,CLzmaProps *propNew,ISzAlloc *alloc)

{
  uint uVar1;
  undefined8 uVar2;
  CLzmaDec *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  UInt32 numProbs;
  undefined4 in_stack_ffffffffffffffd8;
  
  uVar1 = (0x300 << ((char)*in_RSI + (char)in_RSI[1] & 0x1fU)) + 0x736;
  if ((*(long *)(in_RDI + 0x10) == 0) || (uVar1 != *(uint *)(in_RDI + 0x68))) {
    LzmaDec_FreeProbs(in_RDX,(ISzAlloc *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
    uVar2 = (**(code **)&in_RDX->prop)(in_RDX,(ulong)uVar1 << 1);
    *(undefined8 *)(in_RDI + 0x10) = uVar2;
    *(uint *)(in_RDI + 0x68) = uVar1;
    if (*(long *)(in_RDI + 0x10) == 0) {
      return 2;
    }
  }
  return 0;
}

Assistant:

static SRes LzmaDec_AllocateProbs2(CLzmaDec *p, const CLzmaProps *propNew, ISzAlloc *alloc)
{
  UInt32 numProbs = LzmaProps_GetNumProbs(propNew);
  if (!p->probs || numProbs != p->numProbs)
  {
    LzmaDec_FreeProbs(p, alloc);
    p->probs = (CLzmaProb *)alloc->Alloc(alloc, numProbs * sizeof(CLzmaProb));
    p->numProbs = numProbs;
    if (!p->probs)
      return SZ_ERROR_MEM;
  }
  return SZ_OK;
}